

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle_private.hh
# Opt level: O0

shared_ptr<QPDFObject> __thiscall
QPDFObject::create<QPDF_Array,std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>>
          (QPDFObject *this,vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *args)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<QPDFObject> sVar1;
  QPDF_Array local_38;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *local_18;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *args_local;
  
  local_18 = args;
  args_local = (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)this;
  QPDF_Array::QPDF_Array(&local_38,args);
  std::make_shared<QPDFObject,QPDF_Array>((QPDF_Array *)this);
  QPDF_Array::~QPDF_Array(&local_38);
  sVar1.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<QPDFObject>)sVar1.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline std::shared_ptr<QPDFObject>
QPDFObject::create(Args&&... args)
{
    return std::make_shared<QPDFObject>(std::forward<T>(T(std::forward<Args>(args)...)));
}